

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::RALocalAllocator::spillScratchGpRegsBeforeEntry
          (RALocalAllocator *this,RegMask scratchRegs)

{
  bool bVar1;
  Error EVar2;
  int in_ESI;
  RAAssignment *in_RDI;
  Error _err;
  uint32_t workId;
  uint32_t physId;
  BitWordIterator<unsigned_int> it;
  RegGroup group;
  uint32_t in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  int local_2c;
  undefined1 local_25;
  int *local_10;
  int *local_8;
  
  local_25 = 0;
  local_10 = &local_2c;
  local_2c = in_ESI;
  while( true ) {
    do {
      local_8 = &local_2c;
      if (local_2c == 0) {
        return 0;
      }
      Support::BitWordIterator<unsigned_int>::next
                ((BitWordIterator<unsigned_int> *)
                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      bVar1 = RAAssignment::isPhysAssigned
                        (in_RDI,(RegGroup)(in_stack_ffffffffffffffbc >> 0x18),
                         in_stack_ffffffffffffffb8);
    } while (!bVar1);
    in_stack_ffffffffffffffcc =
         RAAssignment::physToWorkId
                   (in_RDI,(RegGroup)(in_stack_ffffffffffffffbc >> 0x18),in_stack_ffffffffffffffb8);
    EVar2 = onSpillReg((RALocalAllocator *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (RegGroup)((ulong)in_RDI >> 0x38),(uint32_t)in_RDI,in_stack_ffffffffffffffbc)
    ;
    if (EVar2 != 0) break;
    in_stack_ffffffffffffffc8 = 0;
  }
  return EVar2;
}

Assistant:

Error RALocalAllocator::spillScratchGpRegsBeforeEntry(RegMask scratchRegs) noexcept {
  RegGroup group = RegGroup::kGp;
  Support::BitWordIterator<RegMask> it(scratchRegs);

  while (it.hasNext()) {
    uint32_t physId = it.next();
    if (_curAssignment.isPhysAssigned(group, physId)) {
      uint32_t workId = _curAssignment.physToWorkId(group, physId);
      ASMJIT_PROPAGATE(onSpillReg(group, workId, physId));
    }
  }

  return kErrorOk;
}